

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O0

Fl_Double_Window * make_decl_panel(void)

{
  Fl_Widget *pFVar1;
  Fl_Group *pFVar2;
  Fl_Group *pFVar3;
  Fl_Menu_ *pFVar4;
  Fl_Text_Editor *pFVar5;
  Fl_Text_Buffer *this;
  Fl_Window *this_00;
  Fl_Button *this_01;
  Fl_Box *o_3;
  Fl_Group *o_2;
  Fl_Box *o_1;
  Fl_Group *o;
  
  pFVar1 = (Fl_Widget *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)pFVar1,0x157,0xed,"Declaration Properties")
  ;
  decl_panel = (Fl_Double_Window *)pFVar1;
  Fl_Widget::align(pFVar1,0x50);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,10,0x10e,0x14,(char *)0x0);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,200,10,0x50,0x14,(char *)0x0);
  pFVar3 = Fl_Group::current();
  Fl_Group::resizable(pFVar3,pFVar1);
  pFVar4 = (Fl_Menu_ *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar4,10,10,0xb9,0x14,(char *)0x0);
  decl_choice = (Fl_Choice *)pFVar4;
  Fl_Menu_::down_box(pFVar4,FL_BORDER_BOX);
  Fl_Widget::labelsize((Fl_Widget *)decl_choice,0xb);
  Fl_Menu_::textsize(&decl_choice->super_Fl_Menu_,0xb);
  Fl_Menu_::menu(&decl_choice->super_Fl_Menu_,menu_decl_choice);
  pFVar4 = (Fl_Menu_ *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar4,10,10,0x4b,0x14,(char *)0x0);
  decl_class_choice = (Fl_Choice *)pFVar4;
  Fl_Menu_::down_box(pFVar4,FL_BORDER_BOX);
  Fl_Widget::labelsize((Fl_Widget *)decl_class_choice,0xb);
  Fl_Menu_::textsize(&decl_class_choice->super_Fl_Menu_,0xb);
  Fl_Menu_::menu(&decl_class_choice->super_Fl_Menu_,menu_decl_class_choice);
  Fl_Group::end(pFVar2);
  pFVar1 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar1,10,0x28,0x140,0x14,
                     "This can be any declaration, like \"int x;\", an external symbol like \"extern int foo();\", a #directive like \"#include <foo.h>\", a comment like \"//foo\" or \"/*foo*/\", or typedef like \"typedef char byte;\" or \"using std::list;\"."
                    );
  decl_input = (Fl_Input *)pFVar1;
  Fl_Widget::tooltip(pFVar1,"Declaration text.");
  Fl_Widget::labelsize((Fl_Widget *)decl_input,0xb);
  Fl_Input_::textfont(&decl_input->super_Fl_Input_,4);
  Fl_Input_::textsize(&decl_input->super_Fl_Input_,0xb);
  Fl_Widget::align((Fl_Widget *)decl_input,0x86);
  Fl_Widget::when((Fl_Widget *)decl_input,'\0');
  pFVar5 = (Fl_Text_Editor *)operator_new(0x1c0);
  Fl_Text_Editor::Fl_Text_Editor(pFVar5,10,0x82,0x140,0x41,"Comment:");
  decl_comment_input = pFVar5;
  Fl_Widget::tooltip((Fl_Widget *)pFVar5,"Declaration comment in Doxygen format");
  Fl_Widget::box((Fl_Widget *)decl_comment_input,FL_DOWN_BOX);
  Fl_Widget::labelfont((Fl_Widget *)decl_comment_input,1);
  Fl_Widget::labelsize((Fl_Widget *)decl_comment_input,0xb);
  Fl_Text_Display::textfont(&decl_comment_input->super_Fl_Text_Display,4);
  Fl_Text_Display::textsize(&decl_comment_input->super_Fl_Text_Display,0xb);
  Fl_Widget::align((Fl_Widget *)decl_comment_input,5);
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,(Fl_Widget *)decl_comment_input);
  pFVar5 = decl_comment_input;
  this = (Fl_Text_Buffer *)operator_new(0x88);
  Fl_Text_Buffer::Fl_Text_Buffer(this,0,0x400);
  Fl_Text_Display::buffer(&pFVar5->super_Fl_Text_Display,this);
  Fl_Text_Editor::add_key_binding(decl_comment_input,0xff09,0,use_tab_navigation);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,0xcd,0x140,0x14,(char *)0x0);
  pFVar1 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar1,200,0xcd,0x3c,0x14,"OK");
  decl_panel_ok = (Fl_Return_Button *)pFVar1;
  Fl_Widget::labelsize(pFVar1,0xb);
  this_00 = Fl_Widget::window((Fl_Widget *)decl_panel_ok);
  Fl_Window::hotspot(this_00,(Fl_Widget *)decl_panel_ok,0);
  this_01 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_01,0x10e,0xcd,0x3c,0x14,"Cancel");
  decl_panel_cancel = this_01;
  Fl_Button::shortcut(this_01,0xff1b);
  Fl_Widget::labelsize(&decl_panel_cancel->super_Fl_Widget,0xb);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,10,0xcd,0xb9,0x14,(char *)0x0);
  pFVar3 = Fl_Group::current();
  Fl_Group::resizable(pFVar3,pFVar1);
  Fl_Group::end(pFVar2);
  Fl_Window::size_range(&decl_panel->super_Fl_Window,0x157,0xed,0,0,0,0,0);
  Fl_Group::end((Fl_Group *)decl_panel);
  return decl_panel;
}

Assistant:

Fl_Double_Window* make_decl_panel() {
  { decl_panel = new Fl_Double_Window(343, 237, "Declaration Properties");
    decl_panel->align(Fl_Align(FL_ALIGN_CLIP|FL_ALIGN_INSIDE));
    { Fl_Group* o = new Fl_Group(10, 10, 270, 20);
      { Fl_Box* o = new Fl_Box(200, 10, 80, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      { decl_choice = new Fl_Choice(10, 10, 185, 20);
        decl_choice->down_box(FL_BORDER_BOX);
        decl_choice->labelsize(11);
        decl_choice->textsize(11);
        decl_choice->menu(menu_decl_choice);
      } // Fl_Choice* decl_choice
      { decl_class_choice = new Fl_Choice(10, 10, 75, 20);
        decl_class_choice->down_box(FL_BORDER_BOX);
        decl_class_choice->labelsize(11);
        decl_class_choice->textsize(11);
        decl_class_choice->menu(menu_decl_class_choice);
      } // Fl_Choice* decl_class_choice
      o->end();
    } // Fl_Group* o
    { decl_input = new Fl_Input(10, 40, 320, 20, "This can be any declaration, like \"int x;\", an external symbol like \"exter\
n int foo();\", a #directive like \"#include <foo.h>\", a comment like \"//foo\
\" or \"/*foo*/\", or typedef like \"typedef char byte;\" or \"using std::list\
;\".");
      decl_input->tooltip("Declaration text.");
      decl_input->labelsize(11);
      decl_input->textfont(4);
      decl_input->textsize(11);
      decl_input->align(Fl_Align(134));
      decl_input->when(FL_WHEN_NEVER);
    } // Fl_Input* decl_input
    { decl_comment_input = new Fl_Text_Editor(10, 130, 320, 65, "Comment:");
      decl_comment_input->tooltip("Declaration comment in Doxygen format");
      decl_comment_input->box(FL_DOWN_BOX);
      decl_comment_input->labelfont(1);
      decl_comment_input->labelsize(11);
      decl_comment_input->textfont(4);
      decl_comment_input->textsize(11);
      decl_comment_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      Fl_Group::current()->resizable(decl_comment_input);
      decl_comment_input->buffer(new Fl_Text_Buffer());
      decl_comment_input->add_key_binding(FL_Tab, 0, use_tab_navigation);
    } // Fl_Text_Editor* decl_comment_input
    { Fl_Group* o = new Fl_Group(10, 205, 320, 20);
      { decl_panel_ok = new Fl_Return_Button(200, 205, 60, 20, "OK");
        decl_panel_ok->labelsize(11);
        decl_panel_ok->window()->hotspot(decl_panel_ok);
      } // Fl_Return_Button* decl_panel_ok
      { decl_panel_cancel = new Fl_Button(270, 205, 60, 20, "Cancel");
        decl_panel_cancel->shortcut(0xff1b);
        decl_panel_cancel->labelsize(11);
      } // Fl_Button* decl_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 205, 185, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    decl_panel->size_range(343, 237);
    decl_panel->end();
  } // Fl_Double_Window* decl_panel
  return decl_panel;
}